

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Ref<embree::Image> __thiscall embree::loadImageFromDisk(embree *this,FileName *fileName)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  string ext;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  FileName::ext_abi_cxx11_(&local_60,fileName);
  toLowerCase(&local_80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_80);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar1 == 0) {
          loadEXR(this,fileName);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar1 == 0) {
            loadPFM(this,fileName);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_80);
            if (iVar1 == 0) {
              loadPPM(this,fileName);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&local_80);
              if (iVar1 != 0) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_40,"image format ",&local_80);
                plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
                local_60._M_dataplus._M_p = (pointer)*plVar2;
                psVar3 = (size_type *)(plVar2 + 2);
                if ((size_type *)local_60._M_dataplus._M_p == psVar3) {
                  local_60.field_2._M_allocated_capacity = *psVar3;
                  local_60.field_2._8_8_ = plVar2[3];
                  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                }
                else {
                  local_60.field_2._M_allocated_capacity = *psVar3;
                }
                local_60._M_string_length = plVar2[1];
                *plVar2 = (long)psVar3;
                plVar2[1] = 0;
                *(undefined1 *)(plVar2 + 2) = 0;
                std::runtime_error::runtime_error(this_00,(string *)&local_60);
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              loadTGA(this,fileName);
            }
          }
        }
        goto LAB_001ac9da;
      }
    }
  }
  loadSTB(this,fileName);
LAB_001ac9da:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return (Ref<embree::Image>)(Image *)this;
}

Assistant:

Ref<Image> loadImageFromDisk(const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());

    if (ext == "bmp" ) return loadSTB(fileName);
    if (ext == "png" ) return loadSTB(fileName);
    if (ext == "jpg" ) return loadSTB(fileName);

    if (ext == "exr" ) return loadEXR(fileName);
    
    if (ext == "pfm" ) return loadPFM(fileName);
    if (ext == "ppm" ) return loadPPM(fileName);
    if (ext == "tga" ) return loadTGA(fileName);
    THROW_RUNTIME_ERROR("image format " + ext + " not supported");
  }